

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdReplace<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this,Instr instr)

{
  uint uVar1;
  uint *puVar2;
  undefined1 local_24 [8];
  Simd<unsigned_int,_(unsigned_char)__x04_> simd;
  uint val;
  Thread *this_local;
  
  unique0x10000088 = this;
  simd.v[2] = Pop<unsigned_int>(this);
  _local_24 = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  uVar1 = simd.v[2];
  puVar2 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                     ((Simd<unsigned_int,_(unsigned_char)__x04_> *)local_24,instr.field_2.imm_u8);
  *puVar2 = uVar1;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,_local_24);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}